

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readoldpsm.c
# Opt level: O0

int it_old_psm_read_patterns(IT_PATTERN *pattern,DUMBFILE *f,int num,int size,int pchans)

{
  byte bVar1;
  int32 iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  void *__ptr;
  uint *puVar6;
  ushort *puVar7;
  ushort *puVar8;
  undefined1 *puVar9;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  IT_PATTERN *p;
  IT_ENTRY *entry;
  uchar *end;
  uchar *ptr;
  uchar *buffer;
  int channel;
  int flags;
  int row;
  int chans;
  int rows;
  int psize;
  int offset;
  int n;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  ushort *local_58;
  int local_3c;
  int local_2c;
  int local_28;
  
  iVar2 = (int32)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  __ptr = malloc((long)in_ECX);
  if (__ptr != (void *)0x0) {
    iVar2 = dumbfile_getnc(in_stack_ffffffffffffff98,iVar2,
                           (DUMBFILE *)
                           CONCAT17(in_stack_ffffffffffffff8f,
                                    CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)));
    if (in_ECX <= iVar2) {
      local_2c = 0;
      local_28 = 0;
      do {
        if (in_EDX <= local_28) {
          free(__ptr);
          return 0;
        }
        puVar6 = (uint *)(in_RDI + (long)local_28 * 0x10);
        if (in_ECX <= local_2c) break;
        puVar7 = (ushort *)((long)__ptr + (long)local_2c);
        uVar3 = (uint)(byte)puVar7[1];
        if ((uVar3 == 0) || (*(char *)((long)puVar7 + 3) == '\0')) {
          *puVar6 = 1;
          puVar6[1] = 0;
        }
        else {
          uVar4 = *puVar7 + 0xf & 0xfffffff0;
          puVar8 = (ushort *)((long)puVar7 + (long)(int)uVar4);
          *puVar6 = uVar3;
          puVar6[1] = uVar3;
          local_3c = 0;
          puVar7 = puVar7 + 2;
          while (local_58 = puVar7, local_3c < (int)uVar3 && local_58 < puVar8) {
            puVar7 = (ushort *)((long)local_58 + 1);
            bVar1 = (byte)*local_58;
            if (bVar1 == 0) {
              local_3c = local_3c + 1;
            }
            else if ((bVar1 & 0xe0) != 0) {
              puVar6[1] = puVar6[1] + 1;
              if ((bVar1 & 0x80) != 0) {
                puVar7 = (ushort *)((long)local_58 + 3);
              }
              local_58 = puVar7;
              if ((bVar1 & 0x40) != 0) {
                local_58 = (ushort *)((long)local_58 + 1);
              }
              puVar7 = local_58;
              if ((bVar1 & 0x20) != 0) {
                if (*(byte *)((long)local_58 + 1) == 0x28) {
                  puVar7 = local_58 + 2;
                }
                else {
                  puVar7 = local_58 + 1;
                }
              }
            }
          }
          puVar9 = (undefined1 *)malloc((long)(int)puVar6[1] * 7);
          if (puVar9 == (undefined1 *)0x0) break;
          *(undefined1 **)(puVar6 + 2) = puVar9;
          local_3c = 0;
          puVar7 = (ushort *)((long)__ptr + (long)local_2c + 4);
          while (local_58 = puVar7, local_3c < (int)uVar3 && local_58 < puVar8) {
            puVar7 = (ushort *)((long)local_58 + 1);
            bVar1 = (byte)*local_58;
            if (bVar1 == 0) {
              *puVar9 = 0xff;
              puVar9 = puVar9 + 7;
              local_3c = local_3c + 1;
            }
            else if ((bVar1 & 0xe0) != 0) {
              puVar9[1] = 0;
              uVar5 = bVar1 & 0x1f;
              *puVar9 = (char)uVar5;
              if ((bVar1 & 0x80) != 0) {
                if ((*(byte *)puVar7 < 0x3c) && ((int)uVar5 < in_R8D)) {
                  puVar9[1] = puVar9[1] | 1;
                  puVar9[2] = *(byte *)puVar7 + 0x23;
                }
                if ((byte)local_58[1] != 0) {
                  puVar9[1] = puVar9[1] | 2;
                  puVar9[3] = (byte)local_58[1];
                }
                puVar7 = (ushort *)((long)local_58 + 3);
              }
              local_58 = puVar7;
              if ((bVar1 & 0x40) != 0) {
                if ((byte)*local_58 < 0x41) {
                  puVar9[1] = puVar9[1] | 4;
                  puVar9[4] = (byte)*local_58;
                }
                local_58 = (ushort *)((long)local_58 + 1);
              }
              if ((bVar1 & 0x20) != 0) {
                puVar9[1] = puVar9[1] | 8;
                switch((byte)*local_58) {
                case 1:
                  puVar9[5] = 0x1e;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 2:
                  puVar9[5] = 4;
                  puVar9[6] = *(byte *)((long)local_58 + 1) << 4;
                  break;
                case 3:
                  puVar9[5] = 0x1d;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 4:
                  puVar9[5] = 4;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf;
                  break;
                default:
                  puVar9[1] = puVar9[1] & 0xf7;
                  break;
                case 10:
                  puVar9[5] = 6;
                  puVar9[6] = *(byte *)((long)local_58 + 1) | 0xf0;
                  break;
                case 0xb:
                  puVar9[5] = 6;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0xc:
                  puVar9[5] = 5;
                  puVar9[6] = *(byte *)((long)local_58 + 1) << 4 | 0xf;
                  break;
                case 0xd:
                  puVar9[5] = 5;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0xe:
                  puVar9[5] = 7;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0xf:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf | 0x10;
                  break;
                case 0x10:
                  puVar9[5] = 0xc;
                  puVar9[6] = *(byte *)((long)local_58 + 1) << 4;
                  break;
                case 0x11:
                  puVar9[5] = 0xc;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf;
                  break;
                case 0x14:
                  puVar9[5] = 8;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x15:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xb | 0x30;
                  break;
                case 0x16:
                  puVar9[5] = 0xb;
                  puVar9[6] = *(byte *)((long)local_58 + 1) << 4;
                  break;
                case 0x17:
                  puVar9[5] = 0xb;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf;
                  break;
                case 0x1e:
                  puVar9[5] = 0x12;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x1f:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xb | 0x40;
                  break;
                case 0x28:
                  puVar9[5] = 0xf;
                  puVar9[6] = (byte)local_58[1];
                  local_58 = local_58 + 1;
                  break;
                case 0x29:
                  puVar9[5] = 0x1f;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x2a:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf | 0xc0;
                  break;
                case 0x2b:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf | 0xd0;
                  break;
                case 0x32:
                  puVar9[5] = 2;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x33:
                  puVar9[5] = 3;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x34:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf | 0xb0;
                  break;
                case 0x35:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf | 0xe0;
                  break;
                case 0x3c:
                  puVar9[5] = 1;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x3d:
                  puVar9[5] = 0x14;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x46:
                  puVar9[5] = 10;
                  puVar9[6] = *(byte *)((long)local_58 + 1);
                  break;
                case 0x47:
                  puVar9[5] = 0x13;
                  puVar9[6] = *(byte *)((long)local_58 + 1) & 0xf | 0x20;
                  break;
                case 0x48:
                  puVar9[5] = 0x18;
                  puVar9[6] = (char)((long)(int)(((uint)*(byte *)((long)local_58 + 1) -
                                                 ((int)(*(byte *)((long)local_58 + 1) & 8) >> 3)) *
                                                0x20) / 7);
                }
                local_58 = local_58 + 1;
              }
              puVar7 = local_58;
              if (puVar9[1] != '\0') {
                puVar9 = puVar9 + 7;
              }
            }
          }
          puVar6[1] = (uint)(((long)puVar9 - *(long *)(puVar6 + 2)) / 7);
          local_2c = uVar4 + local_2c;
        }
        local_28 = local_28 + 1;
      } while( true );
    }
    free(__ptr);
  }
  return -1;
}

Assistant:

static int it_old_psm_read_patterns(IT_PATTERN * pattern, DUMBFILE * f, int num, int size, int pchans)
{
	int n, offset, psize, rows, chans, row, flags, channel;

	unsigned char * buffer, * ptr, * end;

	IT_ENTRY * entry;

	buffer = malloc(size);
	if (!buffer) goto error;

    if (dumbfile_getnc((char *)buffer, size, f) < size) goto error_fb;

	offset = 0;

	for (n = 0; n < num; n++) {
		IT_PATTERN * p = &pattern[n];

		if (offset >= size) goto error_fb;

		ptr = buffer + offset;
		psize = ptr[0] | (ptr[1] << 8);
		rows = ptr[2];
		chans = ptr[3];

		if (!rows || !chans) {
			p->n_rows = 1;
			p->n_entries = 0;
			continue;
		}

		psize = (psize + 15) & ~15;

		end = ptr + psize;
		ptr += 4;

		p->n_rows = rows;
		p->n_entries = rows;
		row = 0;

		while ((row < rows) && (ptr < end)) {
			flags = *ptr++;
			if (!flags) {
				row++;
				continue;
			}
			if (flags & 0xE0) {
				p->n_entries++;
				if (flags & 0x80) ptr += 2;
				if (flags & 0x40) ptr++;
				if (flags & 0x20) {
					ptr++;
					if (*ptr == 40) ptr += 3;
					else ptr++;
				}
			}
		}

		entry = malloc(p->n_entries * sizeof(*p->entry));
		if (!entry) goto error_fb;

		p->entry = entry;

		ptr = buffer + offset + 4;
		row = 0;

		while ((row < rows) && (ptr < end)) {
			flags = *ptr++;
			if (!flags) {
				IT_SET_END_ROW(entry);
				entry++;
				row++;
				continue;
			}
			if (flags & 0xE0) {
				entry->mask = 0;
				entry->channel = channel = flags & 0x1F;
				if (channel >= chans)
				{
					//channel = 0;
					//goto error_fb;
				}
				if (flags & 0x80) {
					if ((*ptr < 60) && (channel < pchans)) {
						entry->mask |= IT_ENTRY_NOTE;
						entry->note = *ptr + 35;
					}
					ptr++;
					if (*ptr) {
						entry->mask |= IT_ENTRY_INSTRUMENT;
						entry->instrument = *ptr;
					}
					ptr++;
				}
				if (flags & 0x40) {
					if (*ptr <= 64) {
						entry->mask |= IT_ENTRY_VOLPAN;
						entry->volpan = *ptr;
					}
					ptr++;
				}
				if (flags & 0x20) {
					entry->mask |= IT_ENTRY_EFFECT;

					switch (*ptr) {
						case 1:
							entry->effect = IT_XM_FINE_VOLSLIDE_UP;
							entry->effectvalue = ptr[1];
							break;

						case 2:
							entry->effect = IT_VOLUME_SLIDE;
							entry->effectvalue = (ptr[1] << 4) & 0xF0;
							break;

						case 3:
							entry->effect = IT_XM_FINE_VOLSLIDE_DOWN;
							entry->effectvalue = ptr[1];
							break;

						case 4:
							entry->effect = IT_VOLUME_SLIDE;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 10:
							entry->effect = IT_PORTAMENTO_UP;
							entry->effectvalue = EFFECT_VALUE(0xF, ptr[1]);
							break;

						case 11:
							entry->effect = IT_PORTAMENTO_UP;
							entry->effectvalue = ptr[1];
							break;

						case 12:
							entry->effect = IT_PORTAMENTO_DOWN;
							entry->effectvalue = EFFECT_VALUE(ptr[1], 0xF);
							break;

						case 13:
							entry->effect = IT_PORTAMENTO_DOWN;
							entry->effectvalue = ptr[1];
							break;

						case 14:
							entry->effect = IT_TONE_PORTAMENTO;
							entry->effectvalue = ptr[1];
							break;

						case 15:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_GLISSANDO_CONTROL, ptr[1] & 15);
							break;

						case 16:
							entry->effect = IT_VOLSLIDE_TONEPORTA;
							entry->effectvalue = ptr[1] << 4;
							break;

						case 17:
							entry->effect = IT_VOLSLIDE_TONEPORTA;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 20:
							entry->effect = IT_VIBRATO;
							entry->effectvalue = ptr[1];
							break;

						case 21:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_VIBRATO_WAVEFORM, ptr[1] & 11);
							break;

						case 22:
							entry->effect = IT_VOLSLIDE_VIBRATO;
							entry->effectvalue = ptr[1] << 4;
							break;

						case 23:
							entry->effect = IT_VOLSLIDE_VIBRATO;
							entry->effectvalue = ptr[1] & 0xF;
							break;

						case 30:
							entry->effect = IT_TREMOLO;
							entry->effectvalue = ptr[1];
							break;

						case 31:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_SET_TREMOLO_WAVEFORM, ptr[1] & 11);
							break;

						case 40:
							entry->effect = IT_SET_SAMPLE_OFFSET;
							entry->effectvalue = ptr[2];
							ptr += 2;
							break;

						case 41:
							entry->effect = IT_XM_RETRIGGER_NOTE;
							entry->effectvalue = ptr[1];
							break;

						case 42:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_DELAYED_NOTE_CUT, ptr[1] & 0xF);
							break;

						case 43:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_NOTE_DELAY, ptr[1] & 0xF);
							break;

						case 50:
							entry->effect = IT_JUMP_TO_ORDER;
							entry->effectvalue = ptr[1];
							break;

						case 51:
							entry->effect = IT_BREAK_TO_ROW;
							entry->effectvalue = ptr[1];
							break;

						case 52:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_PATTERN_LOOP, ptr[1] & 0xF);
							break;

						case 53:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_PATTERN_DELAY, ptr[1] & 0xF);
							break;

						case 60:
							entry->effect = IT_SET_SPEED;
							entry->effectvalue = ptr[1];
							break;

						case 61:
							entry->effect = IT_SET_SONG_TEMPO;
							entry->effectvalue = ptr[1];
							break;

						case 70:
							entry->effect = IT_ARPEGGIO;
							entry->effectvalue = ptr[1];
							break;

						case 71:
							entry->effect = IT_S;
							entry->effectvalue = EFFECT_VALUE(IT_S_FINETUNE, ptr[1] & 0xF);
							break;

						case 72:
							/* "balance" ... panning? */
							entry->effect = IT_SET_PANNING;
							entry->effectvalue = ((ptr[1] - ((ptr[1] & 8) >> 3)) << 5) / 7;
							break;

						default:
							entry->mask &= ~IT_ENTRY_EFFECT;
					}

					ptr += 2;
				}
				if (entry->mask) entry++;
			}
		}

		p->n_entries = (int)(entry - p->entry);
		offset += psize;
	}

	free(buffer);

	return 0;

error_fb:
	free(buffer);
error:
	return -1;
}